

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void handle_D_option(char *z)

{
  char **ppcVar1;
  size_t sVar2;
  char *__dest;
  char **__s;
  long lVar3;
  
  lVar3 = (long)nDefine;
  nDefine = nDefine + 1;
  ppcVar1 = (char **)realloc(azDefine,lVar3 * 8 + 8);
  if (ppcVar1 == (char **)0x0) {
    __s = azDefine;
    azDefine = ppcVar1;
    handle_D_option_cold_2();
  }
  else {
    azDefine = ppcVar1;
    sVar2 = strlen(z);
    __s = (char **)(long)((int)sVar2 + 1);
    __dest = (char *)malloc((size_t)__s);
    ppcVar1[lVar3] = __dest;
    if (__dest != (char *)0x0) {
      strcpy(__dest,z);
      for (; (*__dest != '\0' && (*__dest != '=')); __dest = __dest + 1) {
      }
      *__dest = '\0';
      return;
    }
  }
  handle_D_option_cold_1();
  sVar2 = strlen((char *)__s);
  user_templatename = (char *)malloc((long)((int)sVar2 + 1));
  if (user_templatename != (char *)0x0) {
    strcpy(user_templatename,(char *)__s);
    return;
  }
  handle_T_option_cold_1();
  if (0 < made_files_count) {
    lVar3 = 0;
    do {
      if (successful_exit == 0) {
        remove(made_files[lVar3]);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < made_files_count);
  }
  free(made_files);
  made_files_count = 0;
  made_files = (char **)0x0;
  return;
}

Assistant:

static void handle_D_option(char *z){
  char **paz;
  nDefine++;
  azDefine = (char **) realloc(azDefine, sizeof(azDefine[0])*nDefine);
  if( azDefine==0 ){
    fprintf(stderr,"out of memory\n");
    exit(1);
  }
  paz = &azDefine[nDefine-1];
  *paz = (char *) malloc( lemonStrlen(z)+1 );
  if( *paz==0 ){
    fprintf(stderr,"out of memory\n");
    exit(1);
  }
  strcpy(*paz, z);
  for(z=*paz; *z && *z!='='; z++){}
  *z = 0;
}